

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonReturnParse(sqlite3_context *ctx,JsonParse *p)

{
  byte *pbVar1;
  Mem *pMVar2;
  long in_FS_OFFSET;
  JsonString s;
  JsonString local_a8;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (p->oom == '\0') {
    if (((ulong)ctx->pFunc->pUserData & 8) == 0) {
      memset(&local_a8,0xaa,0x88);
      local_a8.zBuf = local_a8.zSpace;
      local_a8.nAlloc = 100;
      local_a8.nUsed = 0;
      local_a8.bStatic = '\x01';
      local_a8.eErr = '\0';
      p->delta = 0;
      local_a8.pCtx = ctx;
      jsonTranslateBlobToText(p,0,&local_a8);
      jsonReturnString(&local_a8,p,ctx);
      pMVar2 = ctx->pOut;
      pMVar2->eSubtype = 'J';
      pbVar1 = (byte *)((long)&pMVar2->flags + 1);
      *pbVar1 = *pbVar1 | 8;
    }
    else {
      if ((p->nBlobAlloc == 0) || (p->bReadOnly != '\0')) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          setResultStrOrError(ctx,(char *)p->aBlob,p->nBlob,'\0',
                              (_func_void_void_ptr *)0xffffffffffffffff);
          return;
        }
        goto LAB_001bacf3;
      }
      setResultStrOrError(ctx,(char *)p->aBlob,p->nBlob,'\0',sqlite3OomClear);
      p->nBlobAlloc = 0;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    sqlite3_result_error_nomem(ctx);
    return;
  }
LAB_001bacf3:
  __stack_chk_fail();
}

Assistant:

static void jsonReturnParse(
  sqlite3_context *ctx,
  JsonParse *p
){
  int flgs;
  if( p->oom ){
    sqlite3_result_error_nomem(ctx);
    return;
  }
  flgs = SQLITE_PTR_TO_INT(sqlite3_user_data(ctx));
  if( flgs & JSON_BLOB ){
    if( p->nBlobAlloc>0 && !p->bReadOnly ){
      sqlite3_result_blob(ctx, p->aBlob, p->nBlob, SQLITE_DYNAMIC);
      p->nBlobAlloc = 0;
    }else{
      sqlite3_result_blob(ctx, p->aBlob, p->nBlob, SQLITE_TRANSIENT);
    }
  }else{
    JsonString s;
    jsonStringInit(&s, ctx);
    p->delta = 0;
    jsonTranslateBlobToText(p, 0, &s);
    jsonReturnString(&s, p, ctx);
    sqlite3_result_subtype(ctx, JSON_SUBTYPE);
  }
}